

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O2

bool checkLabelDefined(Identifier *labelName,int section)

{
  undefined1 uVar1;
  shared_ptr<Label> label;
  undefined1 local_18 [16];
  
  SymbolTable::getLabel
            ((SymbolTable *)local_18,(Identifier *)&Global.symbolTable,(int)labelName,
             Global.FileInfo.FileNum);
  uVar1 = *(undefined1 *)(local_18._0_8_ + 0x51);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_18 + 8));
  return (bool)uVar1;
}

Assistant:

bool checkLabelDefined(const Identifier& labelName, int section)
{
	std::shared_ptr<Label> label = Global.symbolTable.getLabel(labelName,Global.FileInfo.FileNum,section);
	return label->isDefined();
}